

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O1

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  byte bVar5;
  undefined8 uVar4;
  int iVar6;
  uint uVar7;
  int g;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int a;
  uint uVar18;
  int b;
  code *local_40;
  
  uVar8 = (ulong)(uint)clrBack;
  if (src->trueColor == 0) {
    clrBack = src->green[clrBack] * 0x100 + src->red[clrBack] * 0x10000 + src->blue[clrBack] +
              src->alpha[clrBack] * 0x1000000;
    local_40 = gdImageGetPixel;
  }
  else {
    local_40 = gdImageGetTrueColorPixel;
  }
  if (iOffset < 1) {
    iVar16 = 0;
  }
  else {
    iVar6 = 0;
    do {
      gdImageSetPixel(dst,iVar6,uRow,clrBack);
      iVar6 = iVar6 + 1;
      iVar16 = iOffset;
    } while (iOffset != iVar6);
  }
  if (iVar16 < dst->sx) {
    gdImageSetPixel(dst,iVar16,uRow,clrBack);
  }
  if (src->sx < 1) {
    iVar16 = 0;
    uVar3 = 0;
  }
  else {
    iVar16 = 0;
    do {
      uVar4 = (*local_40)(src,iVar16,uRow);
      iVar6 = src->trueColor;
      uVar2 = (uint)uVar4;
      uVar3 = (uint)((ulong)uVar4 >> 0x10);
      if (iVar6 == 0) {
        uVar15 = src->red[(int)uVar2];
      }
      else {
        uVar15 = uVar3 & 0xff;
      }
      bVar5 = (byte)((ulong)uVar4 >> 8);
      uVar17 = (uint)((ulong)uVar4 >> 0x18);
      if (iVar6 == 0) {
        uVar9 = src->green[(int)uVar2];
        uVar7 = src->blue[(int)uVar2];
        uVar13 = src->alpha[(int)uVar2];
      }
      else {
        uVar9 = (uint)bVar5;
        uVar7 = uVar2 & 0xff;
        uVar13 = uVar17 & 0x7f;
      }
      iVar14 = (int)((double)(int)uVar15 * dWeight);
      iVar10 = (int)((double)(int)uVar7 * dWeight);
      iVar11 = (int)((double)(int)uVar13 * dWeight);
      if (0xfe < iVar14) {
        iVar14 = 0xff;
      }
      iVar1 = (int)((double)(int)uVar9 * dWeight);
      if (0xfe < (int)((double)(int)uVar9 * dWeight)) {
        iVar1 = 0xff;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (0x7e < iVar11) {
        iVar11 = 0x7f;
      }
      if (iVar6 == 0) {
        uVar3 = src->red[(int)uVar2];
      }
      else {
        uVar3 = uVar3 & 0xff;
      }
      uVar15 = (uint)uVar8;
      if (iVar6 == 0) {
        uVar9 = src->red[(int)uVar15];
        uVar7 = src->green[(int)uVar2];
        uVar13 = src->green[(int)uVar15];
        uVar18 = src->blue[(int)uVar2];
        uVar12 = src->blue[(int)uVar15];
        uVar17 = src->alpha[(int)uVar2];
        uVar15 = src->alpha[(int)uVar15];
      }
      else {
        uVar9 = (uint)(uVar8 >> 0x10) & 0xff;
        uVar7 = (uint)bVar5;
        uVar13 = (uint)(byte)(uVar8 >> 8);
        uVar18 = uVar2 & 0xff;
        uVar12 = uVar15 & 0xff;
        uVar17 = uVar17 & 0x7f;
        uVar15 = uVar15 >> 0x18 & 0x7f;
      }
      iVar6 = (uVar3 - iVar14) + uVar9;
      g = (uVar7 - iVar1) + uVar13;
      b = (uVar18 - iVar10) + uVar12;
      a = (uVar17 - iVar11) + uVar15;
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      if (0xfe < g) {
        g = 0xff;
      }
      if (0xfe < b) {
        b = 0xff;
      }
      if (0x7e < a) {
        a = 0x7f;
      }
      if (((ignoretransparent == 0) || (uVar3 = dst->transparent, uVar2 != uVar3)) &&
         (uVar3 = gdImageColorAllocateAlpha(dst,iVar6,g,b,a), uVar3 == 0xffffffff)) {
        uVar3 = gdImageColorClosestAlpha(dst,iVar6,g,b,a);
      }
      iVar6 = iOffset + iVar16;
      if ((-1 < iVar6) && (iVar6 < dst->sx)) {
        gdImageSetPixel(dst,iVar6,uRow,uVar3);
      }
      uVar3 = iVar1 * 0x100 + iVar10 + iVar14 * 0x10000 + iVar11 * 0x1000000;
      iVar16 = iVar16 + 1;
      uVar8 = (ulong)uVar3;
    } while (iVar16 < src->sx);
  }
  iVar16 = iVar16 + iOffset;
  if (iVar16 < dst->sx) {
    gdImageSetPixel(dst,iVar16,uRow,uVar3);
  }
  gdImageSetPixel(dst,iOffset,uRow,clrBack);
  for (; iVar16 < dst->sx; iVar16 = iVar16 + 1) {
    gdImageSetPixel(dst,iVar16,uRow,clrBack);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}